

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

int QMetaObjectPrivate::indexOfMethodRelative<4>
              (QMetaObject **baseObject,QByteArrayView name,int argc,QArgumentType *types)

{
  long lVar1;
  bool bVar2;
  QMetaObjectPrivate *pQVar3;
  QMetaTypeInterface *mobj;
  QMetaObject *in_RDX;
  QMetaMethod *in_RSI;
  QArgumentType *in_RDI;
  long in_FS_OFFSET;
  int end;
  int i;
  QMetaObject *m;
  QMetaMethod data;
  undefined1 in_stack_00000070 [16];
  int index;
  int in_stack_ffffffffffffffc4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mobj = (in_RDI->_metaType).d_ptr;
  do {
    if (mobj == (QMetaTypeInterface *)0x0) {
      index = -1;
LAB_00369306:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return index;
    }
    pQVar3 = priv((uint *)mobj->metaObjectFn);
    index = pQVar3->signalCount;
    while (index = index + -1, -1 < index) {
      QMetaMethod::fromRelativeMethodIndex((QMetaObject *)mobj,index);
      bVar2 = methodMatch(in_RDX,in_RSI,(QByteArrayView)in_stack_00000070,in_stack_ffffffffffffffc4,
                          in_RDI);
      if (bVar2) {
        (in_RDI->_metaType).d_ptr = mobj;
        goto LAB_00369306;
      }
    }
    mobj = (QMetaTypeInterface *)
           QMetaObject::SuperData::operator_cast_to_QMetaObject_((SuperData *)mobj);
  } while( true );
}

Assistant:

inline int QMetaObjectPrivate::indexOfMethodRelative(const QMetaObject **baseObject,
                                        QByteArrayView name, int argc,
                                        const QArgumentType *types)
{
    for (const QMetaObject *m = *baseObject; m; m = m->d.superdata) {
        Q_ASSERT(priv(m->d.data)->revision >= 7);
        int i = (MethodType == MethodSignal)
                 ? (priv(m->d.data)->signalCount - 1) : (priv(m->d.data)->methodCount - 1);
        const int end = (MethodType == MethodSlot)
                        ? (priv(m->d.data)->signalCount) : 0;

        for (; i >= end; --i) {
            auto data = QMetaMethod::fromRelativeMethodIndex(m, i);
            if (methodMatch(m, data, name, argc, types)) {
                *baseObject = m;
                return i;
            }
        }
    }
    return -1;
}